

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeAffix
          (ParsedPatternInfo *this,Endpoints *endpoints,UErrorCode *status)

{
  UChar32 UVar1;
  
  endpoints->start = (this->state).offset;
  do {
    UVar1 = ParserState::peek(&this->state);
    if (UVar1 < 0xa4) {
      switch(UVar1) {
      case 0x23:
      case 0x2a:
      case 0x2c:
      case 0x2e:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3b:
      case 0x40:
switchD_00277033_caseD_23:
        endpoints->end = (this->state).offset;
        return;
      case 0x24:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2f:
      case 0x3a:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
        break;
      case 0x25:
        this->currentSubpattern->hasPercentSign = true;
        break;
      case 0x2b:
        this->currentSubpattern->hasPlusSign = true;
        break;
      case 0x2d:
        this->currentSubpattern->hasMinusSign = true;
        break;
      default:
        if (UVar1 == -1) goto switchD_00277033_caseD_23;
      }
    }
    else if (UVar1 == 0xa4) {
      this->currentSubpattern->hasCurrencySign = true;
    }
    else if (UVar1 == 0x2030) {
      this->currentSubpattern->hasPerMilleSign = true;
    }
    consumeLiteral(this,status);
    if (U_ZERO_ERROR < *status) {
      return;
    }
  } while( true );
}

Assistant:

void ParsedPatternInfo::consumeAffix(Endpoints& endpoints, UErrorCode& status) {
    // literals := { literal }
    endpoints.start = state.offset;
    while (true) {
        switch (state.peek()) {
            case u'#':
            case u'@':
            case u';':
            case u'*':
            case u'.':
            case u',':
            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
            case -1:
                // Characters that cannot appear unquoted in a literal
                // break outer;
                goto after_outer;

            case u'%':
                currentSubpattern->hasPercentSign = true;
                break;

            case u'‰':
                currentSubpattern->hasPerMilleSign = true;
                break;

            case u'¤':
                currentSubpattern->hasCurrencySign = true;
                break;

            case u'-':
                currentSubpattern->hasMinusSign = true;
                break;

            case u'+':
                currentSubpattern->hasPlusSign = true;
                break;

            default:
                break;
        }
        consumeLiteral(status);
        if (U_FAILURE(status)) { return; }
    }
    after_outer:
    endpoints.end = state.offset;
}